

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

matd_chol_t * matd_chol(matd_t *A)

{
  matd_t mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  matd_t *pmVar5;
  ulong uVar6;
  ulong uVar7;
  matd_chol_t *pmVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  matd_t mVar23;
  
  uVar2 = A->nrows;
  uVar22 = (ulong)uVar2;
  if (uVar2 != A->ncols) {
    __assert_fail("A->nrows == A->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x72d,"matd_chol_t *matd_chol(matd_t *)");
  }
  pmVar5 = matd_copy(A);
  if ((int)uVar2 < 1) {
    iVar11 = 1;
  }
  else {
    uVar3 = pmVar5->ncols;
    uVar9 = uVar3 + 1;
    uVar12 = 1;
    uVar14 = 1;
    uVar16 = 0;
    uVar20 = 0;
    iVar11 = 1;
    uVar15 = uVar22;
    uVar17 = uVar9;
    do {
      iVar18 = (int)uVar20;
      mVar1 = pmVar5[(ulong)(uVar9 * iVar18) + 1];
      mVar23.nrows = 0xe2308c3a;
      mVar23.ncols = 0x3e45798e;
      if (1e-08 <= (double)mVar1) {
        mVar23 = mVar1;
      }
      uVar6 = uVar15;
      uVar10 = uVar16;
      do {
        pmVar5[(ulong)uVar10 + 1] =
             (matd_t)((double)pmVar5[(ulong)uVar10 + 1] * (1.0 / SQRT((double)mVar23)));
        uVar10 = uVar10 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      if ((double)mVar1 <= 0.0) {
        iVar11 = 0;
      }
      uVar20 = uVar20 + 1;
      uVar6 = uVar12;
      uVar10 = uVar14;
      uVar13 = uVar17;
      if (uVar20 < uVar22) {
        do {
          mVar1 = pmVar5[(ulong)(uVar3 * iVar18 + (int)uVar6) + 1];
          if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
            uVar7 = uVar6 & 0xffffffff;
            uVar19 = uVar10;
            uVar21 = uVar13;
            do {
              pmVar5[(ulong)uVar21 + 1] =
                   (matd_t)((double)pmVar5[(ulong)uVar21 + 1] -
                           (double)pmVar5[(ulong)uVar19 + 1] * (double)mVar1);
              uVar21 = uVar21 + 1;
              uVar19 = uVar19 + 1;
              uVar4 = (int)uVar7 + 1;
              uVar7 = (ulong)uVar4;
            } while ((int)uVar4 < (int)uVar2);
          }
          uVar6 = uVar6 + 1;
          uVar13 = uVar13 + uVar9;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar22);
      }
      uVar12 = uVar12 + 1;
      uVar16 = uVar16 + uVar9;
      uVar15 = uVar15 - 1;
      uVar17 = uVar17 + uVar9;
      uVar14 = uVar14 + uVar9;
    } while (uVar20 != uVar22);
  }
  pmVar8 = (matd_chol_t *)calloc(1,0x10);
  pmVar8->is_spd = iVar11;
  pmVar8->u = pmVar5;
  return pmVar8;
}

Assistant:

matd_chol_t *matd_chol(matd_t *A)
{
    assert(A->nrows == A->ncols);
    int N = A->nrows;

    // make upper right
    matd_t *U = matd_copy(A);

    // don't actually need to clear lower-left... we won't touch it.
/*    for (int i = 0; i < U->nrows; i++) {
      for (int j = 0; j < i; j++) {
//            assert(MATD_EL(U, i, j) == MATD_EL(U, j, i));
MATD_EL(U, i, j) = 0;
}
}
*/
    int is_spd = 1; // (A->nrows == A->ncols);

    for (int i = 0; i < N; i++) {
        double d = MATD_EL(U, i, i);
        is_spd &= (d > 0);

        if (d < MATD_EPS)
            d = MATD_EPS;
        d = 1.0 / sqrt(d);

        for (int j = i; j < N; j++)
            MATD_EL(U, i, j) *= d;

        for (int j = i+1; j < N; j++) {
            double s = MATD_EL(U, i, j);

            if (s == 0)
                continue;

            for (int k = j; k < N; k++) {
                MATD_EL(U, j, k) -= MATD_EL(U, i, k)*s;
            }
        }
    }

    matd_chol_t *chol = calloc(1, sizeof(matd_chol_t));
    chol->is_spd = is_spd;
    chol->u = U;
    return chol;
}